

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

DetectStreamRez *
METADemuxer::DetectStreamReader
          (DetectStreamRez *__return_storage_ptr__,BufferedReaderManager *readManager,
          string *fileName,bool calcDuration)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  CheckStreamRez *pCVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long *plVar12;
  TSDemuxer *pTVar13;
  _Rb_tree_node_base *p_Var14;
  undefined8 uVar15;
  mapped_type *pmVar16;
  undefined4 extraout_var;
  int64_t iVar17;
  uint8_t *tmpBuffer;
  ssize_t sVar18;
  undefined7 in_register_00000009;
  _Base_ptr p_Var19;
  size_t __nbytes;
  size_type *psVar20;
  long lVar21;
  _Rb_tree_node_base *p_Var22;
  _Base_ptr p_Var23;
  _Rb_tree_header *p_Var24;
  _Alloc_hider _Var25;
  uint uVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  ContainerType containerType;
  string fileExt;
  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
  acceptedPidMap;
  AVChapters chapters;
  DemuxedData demuxedData;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> Vstreams;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> streams;
  string clpiFileName;
  PIDSet acceptedPidSet;
  int64_t discardedSize;
  string unquoted;
  CLPIParser clpi;
  ContainerType local_5f4;
  string local_5e8;
  string local_5c8;
  TSDemuxer *local_5a8;
  undefined4 local_59c;
  undefined1 local_598 [32];
  _Rb_tree_node_base *local_578;
  size_t local_570;
  vector<AVChapter,_std::allocator<AVChapter>_> local_568;
  _Rb_tree_node_base *local_548;
  undefined1 local_540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> local_508;
  vector<CheckStreamRez,_std::allocator<CheckStreamRez>_> local_4e8;
  undefined1 local_4c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  string local_4a0;
  _Alloc_hider local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  _Alloc_hider local_460;
  char *local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Rb_tree_color local_440 [2];
  int64_t local_438;
  bool local_42f;
  undefined1 local_420 [32];
  _Base_ptr local_400;
  size_t local_3f8;
  DetectStreamRez *local_3f0;
  _func_int **local_3e8;
  undefined8 local_3e0;
  string local_3d8;
  CheckStreamRez local_3b8;
  CheckStreamRez local_318;
  undefined1 local_278 [32];
  pointer local_258;
  undefined2 uStack_250;
  undefined6 uStack_24e;
  char acStack_248 [16];
  _Rb_tree<int,_std::pair<const_int,_CLPIStreamInfo>,_std::_Select1st<std::pair<const_int,_CLPIStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  local_238;
  undefined1 local_208 [52];
  undefined5 local_1d4;
  undefined3 uStack_1cf;
  char acStack_1cc [5];
  undefined8 local_1c4;
  size_t local_1b8;
  pointer puStack_1b0;
  pointer local_1a8;
  pointer puStack_1a0;
  pointer local_198;
  undefined1 uStack_190;
  undefined7 uStack_18f;
  undefined1 local_188;
  undefined7 uStack_187;
  bool bStack_180;
  CheckStreamRez local_170;
  CheckStreamRez local_d0;
  undefined4 extraout_var_00;
  
  local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e8.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unquoteStr(&local_3d8,fileName);
  extractFileExt((string *)local_278,&local_3d8);
  strToLowerCase(&local_5c8,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (pointer)0x0;
  local_278._16_8_ = 0;
  local_278._24_8_ = (void *)0x0;
  local_258 = (pointer)0x0;
  uStack_250 = 0;
  uStack_24e = 0;
  acStack_248[0] = '\0';
  acStack_248[1] = '\0';
  acStack_248[2] = '\0';
  acStack_248[3] = '\0';
  acStack_248[4] = '\0';
  acStack_248[5] = '\0';
  acStack_248[6] = '\0';
  acStack_248[7] = '\0';
  acStack_248[8] = '\0';
  acStack_248[9] = '\0';
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208._24_8_ = local_208 + 8;
  local_208._8_4_ = _S_red;
  local_208._16_8_ = (_Base_ptr)0x0;
  local_1c4._0_4_ = 0;
  local_1c4._4_4_ = 0;
  local_208._40_7_ = 0;
  local_208._47_4_ = 0;
  local_1d4 = 0;
  uStack_1cf = 0;
  acStack_1cc[0] = '\0';
  acStack_1cc[1] = '\0';
  acStack_1cc[2] = '\0';
  acStack_1cc[3] = '\0';
  acStack_1cc[4] = '\0';
  local_1b8 = 0;
  puStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  puStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  uStack_190 = 0;
  uStack_18f = 0;
  local_188 = 0;
  uStack_187 = 0;
  bStack_180 = false;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  local_208._32_8_ = local_208._24_8_;
  iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
  if (((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 == 0)) ||
     (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 == 0)) {
    pTVar13 = (TSDemuxer *)operator_new(0x2390);
    TSDemuxer::TSDemuxer(pTVar13,readManager,"");
    extractFileDir((string *)local_540,&local_3d8);
    local_598._0_8_ = local_598 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"CLIPINF","");
    extractFileName(&local_5e8,&local_3d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_5e8);
    psVar20 = (size_type *)(plVar12 + 2);
    if ((size_type *)*plVar12 == psVar20) {
      local_420._16_8_ = *psVar20;
      local_420._24_8_ = plVar12[3];
      local_420._0_8_ = local_420 + 0x10;
    }
    else {
      local_420._16_8_ = *psVar20;
      local_420._0_8_ = (size_type *)*plVar12;
    }
    local_420._8_8_ = plVar12[1];
    *plVar12 = (long)psVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    findBluRayFile((string *)local_4c8,(string *)local_540,(string *)local_598,(string *)local_420);
    if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
      operator_delete((void *)local_420._0_8_,local_420._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
      operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._0_8_ != &local_530) {
      operator_delete((void *)local_540._0_8_,local_530._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._8_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = CLPIParser::parse((CLPIParser *)local_278,(char *)local_4c8._0_8_);
    }
    if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
    }
    local_5f4 = ctM2TS;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
    if (iVar9 == 0) {
      pTVar13 = (TSDemuxer *)operator_new(0x2390);
      TSDemuxer::TSDemuxer(pTVar13,readManager,"");
      local_5f4 = ctTS;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
      if ((iVar9 == 0) || (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 == 0)) {
        pTVar13 = (TSDemuxer *)operator_new(0x7e0);
        ProgramStreamDemuxer::ProgramStreamDemuxer((ProgramStreamDemuxer *)pTVar13,readManager);
        local_5f4 = ctVOB;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
        if (iVar9 == 0) {
          pTVar13 = (TSDemuxer *)operator_new(0x7e0);
          ProgramStreamDemuxer::ProgramStreamDemuxer((ProgramStreamDemuxer *)pTVar13,readManager);
          local_5f4 = ctEVOB;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
          if (((iVar9 == 0) ||
              (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 == 0)) ||
             (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 == 0)) {
            pTVar13 = (TSDemuxer *)operator_new(0x8c8);
            MatroskaDemuxer::MatroskaDemuxer((MatroskaDemuxer *)pTVar13,readManager);
            local_5f4 = ctMKV;
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_5c8);
            if ((((iVar9 != 0) &&
                 (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 != 0)) &&
                (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 != 0)) &&
               (iVar9 = std::__cxx11::string::compare((char *)&local_5c8), iVar9 != 0)) {
              bVar8 = false;
              local_5f4 = ctNone;
              pTVar13 = (TSDemuxer *)0x0;
              goto LAB_001aa5bc;
            }
            pTVar13 = (TSDemuxer *)operator_new(0x470);
            MovDemuxer::MovDemuxer((MovDemuxer *)pTVar13,readManager);
            local_5f4 = ctMOV;
          }
        }
      }
    }
    bVar8 = false;
  }
LAB_001aa5bc:
  if (pTVar13 == (TSDemuxer *)0x0) {
    File::File((File *)local_540);
    __nbytes = 0;
    iVar9 = File::open((File *)local_540,(fileName->_M_dataplus)._M_p,1);
    if ((char)iVar9 == '\0') {
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->streams).
      super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->fileDurationNano = 0;
    }
    else {
      tmpBuffer = (uint8_t *)operator_new__(0x4000000);
      sVar18 = File::read((File *)local_540,(int)tmpBuffer,(void *)0x4000000,__nbytes);
      iVar11 = std::__cxx11::string::compare((char *)&local_5c8);
      if (iVar11 == 0) {
        containerType = ctSUP;
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)&local_5c8);
        containerType = ctLPCM;
        if (((iVar11 != 0) &&
            (iVar11 = std::__cxx11::string::compare((char *)&local_5c8), iVar11 != 0)) &&
           ((iVar11 = std::__cxx11::string::compare((char *)&local_5c8), iVar11 != 0 &&
            (iVar11 = std::__cxx11::string::compare((char *)&local_5c8), iVar11 != 0)))) {
          iVar11 = std::__cxx11::string::compare((char *)&local_5c8);
          containerType = (uint)(iVar11 == 0) * 9;
        }
      }
      detectTrackReader((CheckStreamRez *)local_4c8,tmpBuffer,(int)sVar18,containerType,0,0);
      local_598._0_8_ = local_598 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"V_","");
      bVar8 = strStartWith(&local_4a0,(string *)local_598);
      if ((undefined1 *)local_598._0_8_ != local_598 + 0x10) {
        operator_delete((void *)local_598._0_8_,local_598._16_8_ + 1);
      }
      if (bVar8) {
        CheckStreamRez::CheckStreamRez(&local_d0,(CheckStreamRez *)local_4c8);
        addTrack(&local_508,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.lang._M_dataplus._M_p != &local_d0.lang.field_2) {
          operator_delete(local_d0.lang._M_dataplus._M_p,
                          local_d0.lang.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.streamDescr._M_dataplus._M_p != &local_d0.streamDescr.field_2) {
          operator_delete(local_d0.streamDescr._M_dataplus._M_p,
                          local_d0.streamDescr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.codecInfo.programName._M_dataplus._M_p !=
            &local_d0.codecInfo.programName.field_2) {
          operator_delete(local_d0.codecInfo.programName._M_dataplus._M_p,
                          local_d0.codecInfo.programName.field_2._M_allocated_capacity + 1);
        }
        pCVar5 = &local_d0;
      }
      else {
        CheckStreamRez::CheckStreamRez(&local_170,(CheckStreamRez *)local_4c8);
        addTrack(&local_4e8,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.lang._M_dataplus._M_p != &local_170.lang.field_2) {
          operator_delete(local_170.lang._M_dataplus._M_p,
                          local_170.lang.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.streamDescr._M_dataplus._M_p != &local_170.streamDescr.field_2) {
          operator_delete(local_170.streamDescr._M_dataplus._M_p,
                          local_170.streamDescr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.codecInfo.programName._M_dataplus._M_p !=
            &local_170.codecInfo.programName.field_2) {
          operator_delete(local_170.codecInfo.programName._M_dataplus._M_p,
                          local_170.codecInfo.programName.field_2._M_allocated_capacity + 1);
        }
        pCVar5 = &local_170;
      }
      paVar27 = &(pCVar5->codecInfo).displayName.field_2;
      pcVar4 = (pCVar5->codecInfo).displayName._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar27) {
        operator_delete(pcVar4,paVar27->_M_allocated_capacity + 1);
      }
      operator_delete__(tmpBuffer);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_p != &local_450) {
        operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_p != &local_470) {
        operator_delete(local_480._M_p,local_470._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._8_8_ != &local_4b0) {
        operator_delete((void *)local_4c8._8_8_,local_4b0._0_8_ + 1);
      }
    }
    File::~File((File *)local_540);
    if ((char)iVar9 == '\0') goto LAB_001ab885;
    iVar17 = 0;
  }
  else {
    uVar10 = (*(pTVar13->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xc])(pTVar13);
    (*(pTVar13->super_AbstractDemuxer)._vptr_AbstractDemuxer[2])(pTVar13,fileName);
    local_3e0 = 0;
    local_530._8_8_ = local_540 + 8;
    local_540._8_4_ = _S_red;
    local_530._M_allocated_capacity = 0;
    local_520._8_8_ = 0;
    p_Var22 = (_Rb_tree_node_base *)(local_598 + 8);
    local_598._8_4_ = _S_red;
    local_598._16_8_ = 0;
    local_570 = 0;
    local_5a8 = pTVar13;
    local_598._24_8_ = p_Var22;
    local_578 = p_Var22;
    local_520._M_allocated_capacity = local_530._8_8_;
    (*(pTVar13->super_AbstractDemuxer)._vptr_AbstractDemuxer[10])(pTVar13,local_598);
    local_420._24_8_ = local_420 + 8;
    local_420._8_8_ = local_420._8_8_ & 0xffffffff00000000;
    local_420._16_8_ = 0;
    local_3f8 = 0;
    local_400 = (_Base_ptr)local_420._24_8_;
    if ((_Rb_tree_node_base *)local_598._24_8_ != p_Var22) {
      p_Var14 = (_Rb_tree_node_base *)local_598._24_8_;
      do {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_420,(int *)(p_Var14 + 1));
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
      } while (p_Var14 != p_Var22);
    }
    local_59c = (undefined4)CONCAT71(in_register_00000009,calcDuration);
    if ((_Rb_tree_node_base *)local_530._8_8_ != (_Rb_tree_node_base *)(local_540 + 8)) {
      uVar15 = local_530._8_8_;
      do {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &((_Rb_tree_node_base *)(uVar15 + 0x20))->_M_parent,(ulong)uVar10);
        uVar15 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar15);
      } while ((_Rb_tree_node_base *)uVar15 != (_Rb_tree_node_base *)(local_540 + 8));
    }
    uVar26 = 0;
    local_3f0 = __return_storage_ptr__;
    if (uVar10 < 0x4000001) {
      do {
        (*(local_5a8->super_AbstractDemuxer)._vptr_AbstractDemuxer[7])
                  (local_5a8,local_540,local_420,&local_3e0);
        uVar26 = uVar26 + 1;
      } while (uVar26 < (uint)(0x4000000 / (ulong)uVar10));
    }
    if ((_Rb_tree_node_base *)local_530._8_8_ != (_Rb_tree_node_base *)(local_540 + 8)) {
      local_3e8 = (_func_int **)&PTR__TSDemuxer_00242590;
      uVar15 = local_530._8_8_;
      do {
        p_Var22 = (_Rb_tree_node_base *)(uVar15 + 0x20);
        p_Var23 = ((_Rb_tree_node_base *)(uVar15 + 0x20))->_M_parent;
        p_Var19 = ((_Rb_tree_node_base *)(uVar15 + 0x20))->_M_left;
        uVar2 = *(undefined8 *)(uVar15 + 0x40);
        local_548 = (_Rb_tree_node_base *)uVar15;
        pmVar16 = std::
                  map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                  ::operator[]((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                                *)local_598,(key_type_conflict *)p_Var22);
        if (p_Var23 == p_Var19) {
          p_Var23 = (_Base_ptr)0x0;
        }
        detectTrackReader((CheckStreamRez *)local_4c8,(uint8_t *)p_Var23,(int)uVar2,local_5f4,
                          pmVar16->m_trackType,p_Var22->_M_color);
        p_Var1 = &local_238._M_impl.super__Rb_tree_header;
        if ((local_4a0._M_string_length != 0) && (*local_4a0._M_dataplus._M_p != 'S')) {
          iVar9 = (*(local_5a8->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xd])
                            (local_5a8,(ulong)p_Var22->_M_color);
          local_438 = CONCAT44(extraout_var,iVar9);
        }
        local_440[0] = p_Var22->_M_color;
        std::map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
        ::operator[]((map<int,_TrackInfo,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                      *)local_598,(key_type_conflict *)local_440);
        std::__cxx11::string::_M_assign((string *)&local_460);
        pcVar6 = local_458;
        if (bVar8 != false) {
          p_Var23 = &p_Var1->_M_header;
          if (local_238._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var19 = local_238._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if ((int)p_Var22->_M_color <= (int)*(size_t *)(p_Var19 + 1)) {
                p_Var23 = p_Var19;
              }
              p_Var19 = (&p_Var19->_M_left)[(int)*(size_t *)(p_Var19 + 1) < (int)p_Var22->_M_color];
            } while (p_Var19 != (_Base_ptr)0x0);
          }
          p_Var24 = p_Var1;
          if (((_Rb_tree_header *)p_Var23 != p_Var1) &&
             (p_Var24 = (_Rb_tree_header *)p_Var23,
             (int)p_Var22->_M_color < (int)((_Rb_tree_header *)p_Var23)->_M_node_count)) {
            p_Var24 = p_Var1;
          }
          if (p_Var24 != p_Var1) {
            strlen((char *)((long)(p_Var24 + 1) + 0x20));
            std::__cxx11::string::_M_replace
                      ((ulong)&local_460,0,pcVar6,(ulong)((long)(p_Var24 + 1) + 0x20));
          }
        }
        if ((DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
             langB_abi_cxx11_ == '\0') &&
           (iVar9 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                         ::langB_abi_cxx11_), iVar9 != 0)) {
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                     ::langB_abi_cxx11_,"alb","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[1]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[1].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 1),"arm","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[2]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[2].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 2),"baq","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[3]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[3].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 3),"bur","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[4]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[4].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 4),"cze","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[5]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[5].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 5),"chi","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[6]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[6].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 6),"dut","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[7]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[7].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 7),"ger","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[8]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[8].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 8),"gre","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[9]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[9].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 9),"fre","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[10]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 10),"geo","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0xb]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0xb].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xb),"ice","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0xc]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0xc].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xc),"jaw","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0xd]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0xd].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xd),"mac","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0xe]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0xe].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xe),"mao","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0xf]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0xf].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0xf),"may","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x10]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x10),"mol","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x11]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x11].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x11),"per","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x12]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x12].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x12),"rum","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x13]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x13].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x13),"scc","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x14]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x14].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x14),"scr","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x15]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x15].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x15),"slo","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x16]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x16].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x16),"tib","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langB_abi_cxx11_[0x17]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langB_abi_cxx11_[0x17].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langB_abi_cxx11_ + 0x17),"wel","");
          __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
          __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                               ::langB_abi_cxx11_);
        }
        if ((DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
             langT_abi_cxx11_ == '\0') &&
           (iVar9 = __cxa_guard_acquire(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                         ::langT_abi_cxx11_), iVar9 != 0)) {
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                     ::langT_abi_cxx11_,"sqi","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[1]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[1].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 1),"hye","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[2]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[2].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 2),"eus","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[3]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[3].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 3),"mya","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[4]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[4].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 4),"ces","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[5]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[5].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 5),"zho","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[6]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[6].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 6),"nld","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[7]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[7].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 7),"deu","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[8]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[8].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 8),"ell","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[9]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[9].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 9),"fra","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[10]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 10),"kat","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0xb]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0xb].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xb),"isl","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0xc]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0xc].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xc),"jav","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0xd]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0xd].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xd),"mkd","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0xe]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0xe].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xe),"mri","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0xf]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0xf].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0xf),"fas","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x10]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x10].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x10),"rom","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x11]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x11].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x11),"msa","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x12]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x12].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x12),"ron","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x13]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x13].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x13),"srp","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x14]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x14].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x14),"hrv","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x15]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x15].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x15),"slk","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x16]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x16].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x16),"bod","");
          DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)::
          langT_abi_cxx11_[0x17]._M_dataplus._M_p =
               (pointer)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                         ::langT_abi_cxx11_[0x17].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     (DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                      ::langT_abi_cxx11_ + 0x17),"cym","");
          __cxa_atexit(__cxx_global_array_dtor_163,0,&__dso_handle);
          __cxa_guard_release(&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                               ::langT_abi_cxx11_);
        }
        paVar27 = &local_5e8.field_2;
        lVar21 = 0;
        do {
          if ((local_458 ==
               *(char **)((long)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                 ::langB_abi_cxx11_[0]._M_string_length + lVar21)) &&
             ((local_458 == (char *)0x0 ||
              (iVar9 = bcmp(local_460._M_p,
                            *(void **)((long)&DetectStreamReader(BufferedReaderManager_const&,std::__cxx11::string_const&,bool)
                                              ::langB_abi_cxx11_[0]._M_dataplus._M_p + lVar21),
                            (size_t)local_458), iVar9 == 0)))) {
            std::__cxx11::string::_M_assign((string *)&local_460);
          }
          lVar21 = lVar21 + 0x20;
        } while (lVar21 != 0x300);
        local_5e8._M_dataplus._M_p = (pointer)paVar27;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"A_","");
        bVar7 = strStartWith(&local_4a0,&local_5e8);
        if (bVar7) {
          pp_Var3 = (local_5a8->super_AbstractDemuxer)._vptr_AbstractDemuxer;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != paVar27) {
            operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
          }
          if ((pp_Var3 == local_3e8) && (0x19ff < (int)local_440[0])) {
            local_42f = true;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_5e8._M_dataplus._M_p != paVar27) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        local_5e8._M_dataplus._M_p = (pointer)paVar27;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"V_","");
        bVar7 = strStartWith(&local_4a0,&local_5e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e8._M_dataplus._M_p != paVar27) {
          operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          CheckStreamRez::CheckStreamRez(&local_318,(CheckStreamRez *)local_4c8);
          addTrack(&local_508,&local_318);
          p_Var22 = local_548;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318.lang._M_dataplus._M_p != &local_318.lang.field_2) {
            operator_delete(local_318.lang._M_dataplus._M_p,
                            local_318.lang.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318.streamDescr._M_dataplus._M_p != &local_318.streamDescr.field_2) {
            operator_delete(local_318.streamDescr._M_dataplus._M_p,
                            local_318.streamDescr.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318.codecInfo.programName._M_dataplus._M_p !=
              &local_318.codecInfo.programName.field_2) {
            operator_delete(local_318.codecInfo.programName._M_dataplus._M_p,
                            local_318.codecInfo.programName.field_2._M_allocated_capacity + 1);
          }
          pCVar5 = &local_318;
          _Var25._M_p = local_318.codecInfo.displayName._M_dataplus._M_p;
        }
        else {
          CheckStreamRez::CheckStreamRez(&local_3b8,(CheckStreamRez *)local_4c8);
          addTrack(&local_4e8,&local_3b8);
          p_Var22 = local_548;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.lang._M_dataplus._M_p != &local_3b8.lang.field_2) {
            operator_delete(local_3b8.lang._M_dataplus._M_p,
                            local_3b8.lang.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.streamDescr._M_dataplus._M_p != &local_3b8.streamDescr.field_2) {
            operator_delete(local_3b8.streamDescr._M_dataplus._M_p,
                            local_3b8.streamDescr.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.codecInfo.programName._M_dataplus._M_p !=
              &local_3b8.codecInfo.programName.field_2) {
            operator_delete(local_3b8.codecInfo.programName._M_dataplus._M_p,
                            local_3b8.codecInfo.programName.field_2._M_allocated_capacity + 1);
          }
          pCVar5 = &local_3b8;
          _Var25._M_p = local_3b8.codecInfo.displayName._M_dataplus._M_p;
        }
        paVar27 = &(pCVar5->codecInfo).displayName.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var25._M_p != paVar27) {
          operator_delete(_Var25._M_p,paVar27->_M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_p != &local_450) {
          operator_delete(local_460._M_p,local_450._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_p != &local_470) {
          operator_delete(local_480._M_p,local_470._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
          operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._8_8_ != &local_4b0) {
          operator_delete((void *)local_4c8._8_8_,local_4b0._0_8_ + 1);
        }
        uVar15 = std::_Rb_tree_increment(p_Var22);
      } while ((_Rb_tree_node_base *)uVar15 != (_Rb_tree_node_base *)(local_540 + 8));
    }
    pTVar13 = local_5a8;
    (*(local_5a8->super_AbstractDemuxer)._vptr_AbstractDemuxer[0xe])(&local_5e8,local_5a8);
    local_4c8._16_8_ =
         local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4c8._8_8_ =
         local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_4c8._0_8_ =
         local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_5e8._M_dataplus._M_p;
    local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_5e8._M_string_length;
    local_568.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_5e8.field_2._M_allocated_capacity;
    local_5e8._M_dataplus._M_p = (pointer)0x0;
    local_5e8._M_string_length = 0;
    local_5e8.field_2._M_allocated_capacity = 0;
    std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector
              ((vector<AVChapter,_std::allocator<AVChapter>_> *)local_4c8);
    std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector
              ((vector<AVChapter,_std::allocator<AVChapter>_> *)&local_5e8);
    __return_storage_ptr__ = local_3f0;
    if ((char)local_59c == '\0') {
      iVar17 = 0;
    }
    else {
      iVar9 = (*(pTVar13->super_AbstractDemuxer)._vptr_AbstractDemuxer[0x11])(pTVar13);
      iVar17 = CONCAT44(extraout_var_00,iVar9);
    }
    (*(pTVar13->super_AbstractDemuxer)._vptr_AbstractDemuxer[1])(pTVar13);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_420);
    std::
    _Rb_tree<int,_std::pair<const_int,_TrackInfo>,_std::_Select1st<std::pair<const_int,_TrackInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_TrackInfo>,_std::_Select1st<std::pair<const_int,_TrackInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TrackInfo>_>_>
                 *)local_598);
    std::
    _Rb_tree<int,_std::pair<const_int,_MemoryBlock>,_std::_Select1st<std::pair<const_int,_MemoryBlock>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_MemoryBlock>,_std::_Select1st<std::pair<const_int,_MemoryBlock>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                 *)local_540);
  }
  std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<CheckStreamRez*,std::vector<CheckStreamRez,std::allocator<CheckStreamRez>>>>
            ((vector<CheckStreamRez,std::allocator<CheckStreamRez>> *)&local_508,
             local_508.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_4e8.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_4e8.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
             super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->streams).
  super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->chapters).super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->fileDurationNano = 0;
  std::vector<AVChapter,_std::allocator<AVChapter>_>::operator=
            (&__return_storage_ptr__->chapters,&local_568);
  __return_storage_ptr__->fileDurationNano = iVar17;
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::operator=
            (&__return_storage_ptr__->streams,&local_508);
LAB_001ab885:
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198,CONCAT71(uStack_187,local_188) - (long)local_198);
  }
  if (puStack_1b0 != (pointer)0x0) {
    operator_delete(puStack_1b0,(long)puStack_1a0 - (long)puStack_1b0);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_CLPIStreamInfo>,_std::_Select1st<std::pair<const_int,_CLPIStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_CLPIStreamInfo>,_std::_Select1st<std::pair<const_int,_CLPIStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
               *)local_208);
  std::
  _Rb_tree<int,_std::pair<const_int,_CLPIStreamInfo>,_std::_Select1st<std::pair<const_int,_CLPIStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CLPIStreamInfo>_>_>
  ::~_Rb_tree(&local_238);
  if ((void *)local_278._24_8_ != (void *)0x0) {
    operator_delete((void *)local_278._24_8_,CONCAT62(uStack_24e,uStack_250) - local_278._24_8_);
  }
  if ((pointer)local_278._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ - local_278._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector(&local_508);
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector(&local_4e8);
  std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector(&local_568);
  return __return_storage_ptr__;
}

Assistant:

DetectStreamRez METADemuxer::DetectStreamReader(const BufferedReaderManager& readManager, const string& fileName,
                                                bool calcDuration)
{
    AVChapters chapters;
    int64_t fileDuration = 0;
    vector<CheckStreamRez> streams, Vstreams;
    AbstractDemuxer* demuxer = nullptr;
    auto unquoted = unquoteStr(fileName);
    string fileExt = strToLowerCase(extractFileExt(unquoted));
    AbstractStreamReader::ContainerType containerType = AbstractStreamReader::ContainerType::ctNone;
    CLPIParser clpi;
    bool clpiParsed = false;
    if (fileExt == "m2ts" || fileExt == "mts" || fileExt == "ssif")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctM2TS;
        string clpiFileName = findBluRayFile(extractFileDir(unquoted), "CLIPINF", extractFileName(unquoted) + ".clpi");
        if (!clpiFileName.empty())
            clpiParsed = clpi.parse(clpiFileName.c_str());
    }
    else if (fileExt == "ts")
    {
        demuxer = new TSDemuxer(readManager, "");
        containerType = AbstractStreamReader::ContainerType::ctTS;
    }
    else if (fileExt == "vob" || fileExt == "mpg")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctVOB;
    }
    else if (fileExt == "evo")
    {
        demuxer = new ProgramStreamDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctEVOB;
    }
    else if (fileExt == "mkv" || fileExt == "mka" || fileExt == "mks")
    {
        demuxer = new MatroskaDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMKV;
    }
    else if (fileExt == "mp4" || fileExt == "m4v" || fileExt == "m4a" || fileExt == "mov")
    {
        demuxer = new MovDemuxer(readManager);
        containerType = AbstractStreamReader::ContainerType::ctMOV;
    }

    if (demuxer)
    {
        uint32_t fileBlockSize = demuxer->getFileBlockSize();

        demuxer->openFile(fileName);
        int64_t discardedSize = 0;
        DemuxedData demuxedData;
        map<int32_t, TrackInfo> acceptedPidMap;
        demuxer->getTrackList(acceptedPidMap);
        PIDSet acceptedPidSet;
        for (const auto& itr : acceptedPidMap) acceptedPidSet.insert(itr.first);
        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            vect.reserve(fileBlockSize);
        }

        for (unsigned i = 0; i < DETECT_STREAM_BUFFER_SIZE / fileBlockSize; i++)
            demuxer->simpleDemuxBlock(demuxedData, acceptedPidSet, discardedSize);

        for (auto& itr : demuxedData)
        {
            StreamData& vect = itr.second;
            CheckStreamRez trackRez = detectTrackReader(vect.data(), static_cast<int>(vect.size()), containerType,
                                                        acceptedPidMap[itr.first].m_trackType, itr.first);
            if (!trackRez.codecInfo.programName.empty())
            {
                if (trackRez.codecInfo.programName[0] != 'S')
                    trackRez.delay = demuxer->getTrackDelay(itr.first);
            }
            trackRez.trackID = itr.first;
            trackRez.lang = acceptedPidMap[trackRez.trackID].m_lang;
            if (clpiParsed)
            {
                map<int, CLPIStreamInfo>::const_iterator clpiStream = clpi.m_streamInfo.find(itr.first);
                if (clpiStream != clpi.m_streamInfo.end())
                    trackRez.lang = clpiStream->second.language_code;
            }
            // correct ISO 639-2/B codes to ISO 639-2/T
            static const std::string langB[24] = {
                "alb", "arm", "baq", "bur", "cze", "chi", "dut", "ger", "gre", "fre", "geo", "ice",
                "jaw", "mac", "mao", "may", "mol", "per", "rum", "scc", "scr", "slo", "tib", "wel",
            };
            static const std::string langT[24] = {
                "sqi", "hye", "eus", "mya", "ces", "zho", "nld", "deu", "ell", "fra", "kat", "isl",
                "jav", "mkd", "mri", "fas", "rom", "msa", "ron", "srp", "hrv", "slk", "bod", "cym",
            };
            for (int i = 0; i < 24; i++)
                if (trackRez.lang == langB[i])
                    trackRez.lang = langT[i];

            if (strStartWith(trackRez.codecInfo.programName, "A_") && dynamic_cast<TSDemuxer*>(demuxer))
            {
                if (trackRez.trackID >= 0x1A00)
                    trackRez.isSecondary = true;
            }

            if (strStartWith(trackRez.codecInfo.programName, "V_"))
                addTrack(Vstreams, trackRez);
            else
                addTrack(streams, trackRez);
        }
        chapters = demuxer->getChapters();
        if (calcDuration)
            fileDuration = demuxer->getFileDurationNano();
        delete demuxer;
    }
    else
    {
        File file;
        containerType = AbstractStreamReader::ContainerType::ctNone;
        if (!file.open(fileName.c_str(), File::ofRead))
            return {};
        auto tmpBuffer = new uint8_t[DETECT_STREAM_BUFFER_SIZE];
        int len = file.read(tmpBuffer, DETECT_STREAM_BUFFER_SIZE);
        if (fileExt == "sup")
            containerType = AbstractStreamReader::ContainerType::ctSUP;
        else if (fileExt == "pcm" || fileExt == "lpcm" || fileExt == "wav" || fileExt == "w64")
            containerType = AbstractStreamReader::ContainerType::ctLPCM;
        else if (fileExt == "srt")
            containerType = AbstractStreamReader::ContainerType::ctSRT;
        CheckStreamRez trackRez = detectTrackReader(tmpBuffer, len, containerType, 0, 0);

        if (strStartWith(trackRez.codecInfo.programName, "V_"))
            addTrack(Vstreams, trackRez);
        else
            addTrack(streams, trackRez);

        delete[] tmpBuffer;
    }
    Vstreams.insert(Vstreams.end(), streams.begin(), streams.end());

    DetectStreamRez rez;
    rez.chapters = chapters;
    rez.fileDurationNano = fileDuration;
    rez.streams = Vstreams;
    return rez;
}